

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O2

void Map_MappingSetupTruthTablesLarge(uint (*uTruths) [32])

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  uint (*pauVar4) [32];
  long lVar5;
  
  lVar1 = 0;
  puVar2 = *uTruths;
  for (; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x500; lVar3 = lVar3 + 0x80) {
      *(undefined4 *)((long)puVar2 + lVar3) = 0;
    }
    puVar2 = puVar2 + 1;
  }
  lVar1 = 0x280;
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    pauVar4 = uTruths;
    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
      if (((uint)lVar3 >> ((uint)lVar5 & 0x1f) & 1) != 0) {
        (*pauVar4)[0] = (*pauVar4)[0] | 1 << ((byte)lVar3 & 0x1f);
        *(undefined4 *)((long)*pauVar4 + lVar1) = 0xffffffff;
      }
      pauVar4 = pauVar4 + 1;
    }
    lVar1 = lVar1 + 4;
  }
  lVar1 = 0;
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 != 0x280; lVar5 = lVar5 + 0x80) {
      *(undefined4 *)((long)*uTruths + lVar5 + lVar1) = *(undefined4 *)((long)*uTruths + lVar5);
    }
    lVar1 = lVar1 + 4;
  }
  return;
}

Assistant:

void Map_MappingSetupTruthTablesLarge( unsigned uTruths[][32] )
{
    int m, v;
    // clean everything
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 10; v++ )
            uTruths[v][m] = 0;
    // set up the truth tables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            if ( m & (1 << v) )
            {
                uTruths[v][0] |= (1 << m);
                uTruths[v+5][m] = MAP_FULL;
            }
    // extend this info for the rest of the first 5 variables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            uTruths[v][m] = uTruths[v][0];
/*
    // verify
    for ( m = 0; m < 1024; m++, printf("\n") )
        for ( v = 0; v < 10; v++ )
            if ( Map_InfoReadVar( uTruths[v], m ) )
                printf( "1" );
            else
                printf( "0" );
*/
}